

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_TrueTypeEngineType FT_Get_TrueType_Engine_Type(FT_Library library)

{
  FT_Module module_00;
  FT_TrueTypeEngineType *pFVar1;
  FT_Service_TrueTypeEngine service;
  FT_Module module;
  FT_TrueTypeEngineType result;
  FT_Library library_local;
  
  module._4_4_ = FT_TRUETYPE_ENGINE_TYPE_NONE;
  if (((library != (FT_Library)0x0) &&
      (module_00 = FT_Get_Module(library,"truetype"), module_00 != (FT_Module)0x0)) &&
     (pFVar1 = (FT_TrueTypeEngineType *)ft_module_get_service(module_00,"truetype-engine",'\0'),
     pFVar1 != (FT_TrueTypeEngineType *)0x0)) {
    module._4_4_ = *pFVar1;
  }
  return module._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_TrueTypeEngineType )
  FT_Get_TrueType_Engine_Type( FT_Library  library )
  {
    FT_TrueTypeEngineType  result = FT_TRUETYPE_ENGINE_TYPE_NONE;


    if ( library )
    {
      FT_Module  module = FT_Get_Module( library, "truetype" );


      if ( module )
      {
        FT_Service_TrueTypeEngine  service;


        service = (FT_Service_TrueTypeEngine)
                    ft_module_get_service( module,
                                           FT_SERVICE_ID_TRUETYPE_ENGINE,
                                           0 );
        if ( service )
          result = service->engine_type;
      }
    }

    return result;
  }